

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimeGenerator.cpp
# Opt level: O3

size_t __thiscall primesieve::PrimeGenerator::getStopIdx(PrimeGenerator *this)

{
  ulong uVar1;
  size_t sVar2;
  
  uVar1 = (this->super_Erat).stop_;
  sVar2 = 0x80;
  if (uVar1 < 0x2cf) {
    sVar2 = (size_t)(byte)(anonymous_namespace)::primePi[uVar1];
  }
  return sVar2;
}

Assistant:

size_t PrimeGenerator::getStopIdx() const
{
  size_t stopIdx = 0;

  if (stop_ < maxCachedPrime())
    stopIdx = primePi[stop_];
  else
    stopIdx = smallPrimes.size();

  return stopIdx;
}